

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void vdbeMemClearExternAndSetNull(Mem *p)

{
  ushort uVar1;
  RowSet *pRVar2;
  
  if ((p->flags & 0x2000) != 0) {
    sqlite3VdbeMemFinalize(p,(p->u).pDef);
  }
  uVar1 = p->flags;
  if ((uVar1 >> 10 & 1) == 0) {
    if ((uVar1 & 0x20) == 0) {
      if ((uVar1 & 0x40) != 0) {
        pRVar2 = (p->u).pRowSet;
        pRVar2->db = (sqlite3 *)pRVar2->pChunk->aEntry[10].v;
        pRVar2->pChunk->aEntry[10].v = (i64)pRVar2;
      }
    }
    else {
      sqlite3RowSetClear((p->u).pRowSet);
    }
  }
  else {
    (*p->xDel)(p->z);
  }
  p->flags = 1;
  return;
}

Assistant:

static SQLITE_NOINLINE void vdbeMemClearExternAndSetNull(Mem *p){
  assert( p->db==0 || sqlite3_mutex_held(p->db->mutex) );
  assert( VdbeMemDynamic(p) );
  if( p->flags&MEM_Agg ){
    sqlite3VdbeMemFinalize(p, p->u.pDef);
    assert( (p->flags & MEM_Agg)==0 );
    testcase( p->flags & MEM_Dyn );
  }
  if( p->flags&MEM_Dyn ){
    assert( (p->flags&MEM_RowSet)==0 );
    assert( p->xDel!=SQLITE_DYNAMIC && p->xDel!=0 );
    p->xDel((void *)p->z);
  }else if( p->flags&MEM_RowSet ){
    sqlite3RowSetClear(p->u.pRowSet);
  }else if( p->flags&MEM_Frame ){
    VdbeFrame *pFrame = p->u.pFrame;
    pFrame->pParent = pFrame->v->pDelFrame;
    pFrame->v->pDelFrame = pFrame;
  }
  p->flags = MEM_Null;
}